

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::GLMRegressor::ByteSizeLong(GLMRegressor *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Type *pTVar4;
  ulong uVar5;
  long lVar6;
  uint index;
  ulong uVar7;
  size_t sVar8;
  
  uVar3 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
  uVar7 = (ulong)uVar3;
  if (uVar7 == 0) {
    uVar7 = 0;
  }
  else {
    index = 0;
    do {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                         (&(this->weights_).super_RepeatedPtrFieldBase,index);
      uVar5 = (ulong)(uint)(pTVar4->value_).current_size_;
      lVar6 = uVar5 * 8;
      uVar2 = (uint)lVar6;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else if ((int)uVar2 < 0) {
        uVar5 = 0xb;
      }
      else {
        iVar1 = 0x1f;
        if ((uVar2 | 1) != 0) {
          for (; (uVar2 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
      }
      pTVar4->_value_cached_byte_size_ = uVar2;
      lVar6 = uVar5 + lVar6;
      uVar2 = (uint)lVar6;
      pTVar4->_cached_size_ = uVar2;
      uVar2 = uVar2 | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = uVar7 + lVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar3 != index);
  }
  uVar5 = (ulong)(uint)(this->offset_).current_size_;
  lVar6 = uVar5 * 8;
  uVar3 = (uint)lVar6;
  if (uVar5 != 0) {
    if ((int)uVar3 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    uVar7 = uVar7 + uVar5;
  }
  this->_offset_cached_byte_size_ = uVar3;
  sVar8 = uVar7 + lVar6;
  uVar3 = this->postevaluationtransform_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar8 = sVar8 + uVar7;
  }
  this->_cached_size_ = (int)sVar8;
  return sVar8;
}

Assistant:

size_t GLMRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GLMRegressor)
  size_t total_size = 0;

  // repeated .CoreML.Specification.GLMRegressor.DoubleArray weights = 1;
  {
    unsigned int count = this->weights_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->weights(i));
    }
  }

  // repeated double offset = 2;
  {
    unsigned int count = this->offset_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _offset_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.GLMRegressor.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->postevaluationtransform() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->postevaluationtransform());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}